

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O3

void lyd_diff_del_meta(lyd_node *node,char *name)

{
  lys_module *plVar1;
  lyd_attr *attr;
  lyd_meta *meta;
  lyd_attr *local_20;
  lyd_meta *local_18;
  
  lyd_diff_find_meta(node,name,&local_18,&local_20);
  if (local_18 == (lyd_meta *)0x0) {
    if (local_20 != (lyd_attr *)0x0) {
      if (node->schema == (lysc_node *)0x0) {
        plVar1 = (lys_module *)&node[2].schema;
      }
      else {
        plVar1 = node->schema->module;
      }
      lyd_free_attr_single(plVar1->ctx,local_20);
    }
  }
  else {
    lyd_free_meta_single(local_18);
  }
  return;
}

Assistant:

static void
lyd_diff_del_meta(struct lyd_node *node, const char *name)
{
    struct lyd_meta *meta;
    struct lyd_attr *attr;

    lyd_diff_find_meta(node, name, &meta, &attr);

    if (meta) {
        lyd_free_meta_single(meta);
    } else if (attr) {
        lyd_free_attr_single(LYD_CTX(node), attr);
    }
}